

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              char **err)

{
  undefined4 in_EAX;
  int iVar1;
  EXRHeader **ppEVar2;
  EXRHeader *exr_header;
  char *pcVar3;
  pointer paVar4;
  pointer paVar5;
  ulong uVar6;
  size_t i;
  uchar *buf;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool empty_header;
  char **local_110;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  string err_str;
  HeaderInfo info;
  
  auVar9._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar9._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar9._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar9._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar1 = movmskps(in_EAX,auVar9);
  if (iVar1 == 0) {
    buf = memory + 8;
    infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_110 = err;
    while( true ) {
      info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info.channels.super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      info.channels.super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      info.channels.super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tinyexr::anon_struct_128_15_3efe3611::clear(&info);
      err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
      err_str._M_string_length = 0;
      err_str.field_2._M_local_buf[0] = '\0';
      empty_header = false;
      iVar1 = tinyexr::ParseEXRHeader(&info,&empty_header,exr_version,&err_str,buf);
      if (iVar1 != 0) break;
      if (empty_header != false) {
        std::__cxx11::string::~string((string *)&err_str);
        tinyexr::anon_struct_128_15_3efe3611::~HeaderInfo(&info);
        paVar4 = infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        paVar5 = infos.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppEVar2 = (EXRHeader **)
                  malloc((long)infos.
                               super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)infos.
                               super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
        *exr_headers = ppEVar2;
        lVar8 = 0;
        for (uVar7 = 0; uVar6 = (long)paVar5 - (long)paVar4 >> 7, uVar7 < uVar6; uVar7 = uVar7 + 1)
        {
          exr_header = (EXRHeader *)malloc(0x10890);
          tinyexr::ConvertHeader
                    (exr_header,(HeaderInfo *)((long)paVar4->data_window + lVar8 + -0x30));
          exr_header->tiled = exr_version->tiled;
          (*exr_headers)[uVar7] = exr_header;
          lVar8 = lVar8 + 0x80;
          paVar4 = infos.
                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          paVar5 = infos.
                   super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        *num_headers = (int)uVar6;
        iVar1 = 0;
        goto LAB_001257dd;
      }
      if (info.chunk_count == 0) {
        iVar1 = -4;
        if (local_110 == (char **)0x0) goto LAB_001257c9;
        pcVar3 = "`chunkCount\' attribute is not found in the header.";
        goto LAB_001257c1;
      }
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                (&infos,&info);
      buf = buf + info.header_len;
      std::__cxx11::string::~string((string *)&err_str);
      tinyexr::anon_struct_128_15_3efe3611::~HeaderInfo(&info);
    }
    if (local_110 != (char **)0x0) {
      pcVar3 = strdup(err_str._M_dataplus._M_p);
LAB_001257c1:
      *local_110 = pcVar3;
    }
LAB_001257c9:
    std::__cxx11::string::~string((string *)&err_str);
    tinyexr::anon_struct_128_15_3efe3611::~HeaderInfo(&info);
LAB_001257dd:
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&infos);
  }
  else {
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             reinterpret_cast<const unsigned char *>(marker));

    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        (*err) = strdup(err_str.c_str());  // may leak
      }
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      if (err) {
        (*err) = "`chunkCount' attribute is not found in the header.";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}